

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx512(uint16_t *data,uint32_t len,uint32_t *flags)

{
  int i;
  uint uVar1;
  undefined1 (*pauVar2) [64];
  long lVar3;
  undefined1 (*__s) [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar30 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar31 [16];
  undefined1 in_ZMM20 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 in_ZMM21 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [16];
  undefined1 in_ZMM22 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [16];
  undefined1 in_ZMM24 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 in_ZMM25 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined1 in_ZMM26 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 in_ZMM31 [64];
  undefined1 auVar52 [64];
  uint32_t out_counters [16];
  __m512i masks [16];
  undefined1 local_9c0 [5] [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  auVar51 = in_ZMM31._0_16_;
  auVar49 = in_ZMM30._0_16_;
  auVar47 = in_ZMM29._0_16_;
  auVar45 = in_ZMM28._0_16_;
  auVar43 = in_ZMM27._0_16_;
  auVar41 = in_ZMM26._0_16_;
  auVar39 = in_ZMM25._0_16_;
  auVar37 = in_ZMM24._0_16_;
  auVar35 = in_ZMM22._0_16_;
  auVar33 = in_ZMM21._0_16_;
  auVar31 = in_ZMM20._0_16_;
  auVar5 = in_ZMM17._0_16_;
  auVar4 = in_ZMM19._0_16_;
  __s = &local_880;
  lVar3 = 0;
  memset(__s,0,0x400);
  pauVar2 = &local_480;
  do {
    lVar3 = lVar3 + 1;
    auVar7 = vpbroadcastw_avx512bw();
    auVar7 = vmovdqa64_avx512f(auVar7);
    *pauVar2 = auVar7;
    pauVar2 = pauVar2 + 1;
  } while (lVar3 != 0x10);
  auVar4 = vpxord_avx512vl(auVar4,auVar4);
  auVar7 = ZEXT1664(auVar4);
  local_9c0[0] = vmovdqa64_avx512f(auVar7);
  if (0x1f < len) {
    auVar8 = vmovdqa64_avx512f(local_440);
    auVar9 = vmovdqa64_avx512f(local_400);
    auVar10 = vmovdqa64_avx512f(local_380);
    auVar11 = vmovdqa64_avx512f(local_340);
    auVar12 = vmovdqa64_avx512f(local_300);
    auVar13 = vmovdqa64_avx512f(local_2c0);
    auVar14 = vmovdqa64_avx512f(local_280);
    auVar15 = vmovdqa64_avx512f(local_240);
    auVar16 = vmovdqa64_avx512f(local_200);
    auVar17 = vmovdqa64_avx512f(local_1c0);
    auVar18 = vmovdqa64_avx512f(local_180);
    auVar19 = vmovdqa64_avx512f(local_140);
    auVar20 = vmovdqa64_avx512f(local_100);
    auVar21 = vmovdqa64_avx512f(local_c0);
    auVar22 = vpbroadcastd_avx512f(ZEXT416(1));
    auVar28 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar5 = vpxord_avx512vl(auVar5,auVar5);
    auVar30 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar31,auVar31);
    auVar32 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar33,auVar33);
    auVar34 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar35,auVar35);
    auVar36 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar37,auVar37);
    auVar38 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar39,auVar39);
    auVar40 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar41,auVar41);
    auVar42 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar43,auVar43);
    auVar44 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar45,auVar45);
    auVar46 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar47,auVar47);
    auVar48 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar49,auVar49);
    auVar50 = ZEXT1664(auVar5);
    auVar5 = vpxord_avx512vl(auVar51,auVar51);
    auVar52 = ZEXT1664(auVar5);
    lVar3 = 0;
    auVar23 = vmovdqa64_avx512f(local_3c0);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar23 = vmovdqa64_avx512f(auVar23);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + lVar3));
      lVar3 = lVar3 + 0x40;
      auVar25._8_8_ = local_480._8_8_;
      auVar25._0_8_ = local_480._0_8_;
      auVar25._16_8_ = local_480._16_8_;
      auVar25._24_8_ = local_480._24_8_;
      auVar25._32_8_ = local_480._32_8_;
      auVar25._40_8_ = local_480._40_8_;
      auVar25._48_8_ = local_480._48_8_;
      auVar25._56_8_ = local_480._56_8_;
      auVar25 = vpandq_avx512f(auVar24,auVar25);
      auVar26 = vpsrld_avx512f(auVar25,0x10);
      auVar25 = vpandd_avx512f(auVar25,auVar22);
      auVar7 = vpaddd_avx512f(auVar26,auVar7);
      auVar7 = vpaddd_avx512f(auVar7,auVar25);
      auVar25 = vpandq_avx512f(auVar24,auVar8);
      auVar26 = vpsrld_avx512f(auVar25,1);
      auVar25 = vpsrld_avx512f(auVar25,0x11);
      auVar27 = vpaddd_avx512f(auVar25,auVar27);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar27 = vpaddd_avx512f(auVar27,auVar25);
      auVar25 = vpandq_avx512f(auVar24,auVar9);
      auVar26 = vpsrld_avx512f(auVar25,2);
      auVar25 = vpsrld_avx512f(auVar25,0x12);
      auVar52 = vpaddd_avx512f(auVar25,auVar52);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar52 = vpaddd_avx512f(auVar52,auVar25);
      auVar25 = vpandq_avx512f(auVar24,auVar23);
      auVar26 = vpsrld_avx512f(auVar25,3);
      auVar25 = vpsrld_avx512f(auVar25,0x13);
      auVar50 = vpaddd_avx512f(auVar25,auVar50);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar50 = vpaddd_avx512f(auVar50,auVar25);
      auVar25 = vpandq_avx512f(auVar10,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,4);
      auVar25 = vpsrld_avx512f(auVar25,0x14);
      auVar48 = vpaddd_avx512f(auVar25,auVar48);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar48 = vpaddd_avx512f(auVar48,auVar25);
      auVar25 = vpandq_avx512f(auVar11,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,5);
      auVar25 = vpsrld_avx512f(auVar25,0x15);
      auVar46 = vpaddd_avx512f(auVar25,auVar46);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar46 = vpaddd_avx512f(auVar46,auVar25);
      auVar25 = vpandq_avx512f(auVar12,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,6);
      auVar25 = vpsrld_avx512f(auVar25,0x16);
      auVar44 = vpaddd_avx512f(auVar25,auVar44);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar44 = vpaddd_avx512f(auVar44,auVar25);
      auVar25 = vpandq_avx512f(auVar13,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,7);
      auVar25 = vpsrld_avx512f(auVar25,0x17);
      auVar42 = vpaddd_avx512f(auVar25,auVar42);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar42 = vpaddd_avx512f(auVar42,auVar25);
      auVar25 = vpandq_avx512f(auVar14,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,8);
      auVar25 = vpsrld_avx512f(auVar25,0x18);
      auVar40 = vpaddd_avx512f(auVar25,auVar40);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar40 = vpaddd_avx512f(auVar40,auVar25);
      auVar25 = vpandq_avx512f(auVar15,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,9);
      auVar25 = vpsrld_avx512f(auVar25,0x19);
      auVar38 = vpaddd_avx512f(auVar25,auVar38);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar38 = vpaddd_avx512f(auVar38,auVar25);
      auVar25 = vpandq_avx512f(auVar16,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,10);
      auVar25 = vpsrld_avx512f(auVar25,0x1a);
      auVar36 = vpaddd_avx512f(auVar25,auVar36);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar36 = vpaddd_avx512f(auVar36,auVar25);
      auVar25 = vpandq_avx512f(auVar17,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,0xb);
      auVar25 = vpsrld_avx512f(auVar25,0x1b);
      auVar34 = vpaddd_avx512f(auVar25,auVar34);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar34 = vpaddd_avx512f(auVar34,auVar25);
      auVar25 = vpandq_avx512f(auVar18,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,0xc);
      auVar25 = vpsrld_avx512f(auVar25,0x1c);
      auVar32 = vpaddd_avx512f(auVar25,auVar32);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar32 = vpaddd_avx512f(auVar32,auVar25);
      auVar25 = vpandq_avx512f(auVar19,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,0xd);
      auVar25 = vpsrld_avx512f(auVar25,0x1d);
      auVar30 = vpaddd_avx512f(auVar25,auVar30);
      auVar25 = vpandd_avx512f(auVar26,auVar22);
      auVar30 = vpaddd_avx512f(auVar30,auVar25);
      auVar25 = vpandq_avx512f(auVar20,auVar24);
      auVar24 = vpandq_avx512f(auVar21,auVar24);
      auVar26 = vpsrld_avx512f(auVar25,0x1e);
      auVar25 = vpsrld_avx512f(auVar25,0xe);
      auVar29 = vpaddd_avx512f(auVar26,auVar29);
      auVar25 = vpandd_avx512f(auVar25,auVar22);
      auVar29 = vpaddd_avx512f(auVar29,auVar25);
      auVar25 = vpsrld_avx512f(auVar24,0x1f);
      auVar24 = vpsrld_avx512f(auVar24,0xf);
      auVar28 = vpaddd_avx512f(auVar25,auVar28);
      auVar25 = vpandd_avx512f(auVar24,auVar22);
      auVar28 = vpaddd_avx512f(auVar28,auVar25);
    } while ((ulong)(len >> 5) << 6 != lVar3);
    local_840 = vmovdqa64_avx512f(auVar27);
    local_800 = vmovdqa64_avx512f(auVar52);
    local_7c0 = vmovdqa64_avx512f(auVar50);
    local_780 = vmovdqa64_avx512f(auVar48);
    local_740 = vmovdqa64_avx512f(auVar46);
    local_700 = vmovdqa64_avx512f(auVar44);
    local_6c0 = vmovdqa64_avx512f(auVar42);
    local_680 = vmovdqa64_avx512f(auVar40);
    local_640 = vmovdqa64_avx512f(auVar38);
    local_600 = vmovdqa64_avx512f(auVar36);
    local_5c0 = vmovdqa64_avx512f(auVar34);
    local_580 = vmovdqa64_avx512f(auVar32);
    local_540 = vmovdqa64_avx512f(auVar30);
    local_500 = vmovdqa64_avx512f(auVar29);
    local_4c0 = vmovdqa64_avx512f(auVar28);
  }
  uVar1 = len & 0xffffffe0;
  local_880 = vmovdqa64_avx512f(auVar7);
  if (uVar1 != len) {
    auVar7 = vmovdqa64_avx512f(local_9c0[0]);
    auVar8 = vpmovsxbd_avx512f(_DAT_00115080);
    auVar9 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar1 = uVar1 + 1;
      auVar23 = vpbroadcastd_avx512f();
      auVar23 = vpsrlvd_avx512f(auVar23,auVar8);
      auVar23 = vpandd_avx512f(auVar23,auVar9);
      auVar7 = vpaddd_avx512f(auVar23,auVar7);
    } while (uVar1 < len);
    local_9c0[0] = vmovdqa64_avx512f(auVar7);
  }
  lVar3 = 0;
  do {
    auVar7 = vpaddd_avx512f(ZEXT464(*(uint *)(local_9c0[0] + lVar3 * 4)),*__s);
    __s = __s + 1;
    auVar6 = vextracti64x4_avx512f(auVar7,1);
    auVar7 = vpaddd_avx512f(auVar7,ZEXT3264(auVar6));
    auVar5 = vpaddd_avx(auVar7._0_16_,auVar7._16_16_);
    auVar4 = vpshufd_avx(auVar5,0xee);
    auVar5 = vpaddd_avx(auVar5,auVar4);
    auVar4 = vpshufd_avx(auVar5,0x55);
    auVar5 = vpaddd_avx(auVar5,auVar4);
    *(int *)(local_9c0[0] + lVar3 * 4) = auVar5._0_4_;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  *(undefined8 *)flags = local_9c0[0]._0_8_;
  *(undefined8 *)(flags + 2) = local_9c0[0]._8_8_;
  *(undefined8 *)(flags + 4) = local_9c0[0]._16_8_;
  *(undefined8 *)(flags + 6) = local_9c0[0]._24_8_;
  *(undefined8 *)(flags + 8) = local_9c0[0]._32_8_;
  *(undefined8 *)(flags + 10) = local_9c0[0]._40_8_;
  *(undefined8 *)(flags + 0xc) = local_9c0[0]._48_8_;
  *(undefined8 *)(flags + 0xe) = local_9c0[0]._56_8_;
  return 0;
}

Assistant:

int pospopcnt_u16_avx512(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    __m512i counters[16];
    const __m512i one_mask = _mm512_set1_epi32(1);
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm512_set1_epi16(1 << i);
        counters[i] = _mm512_set1_epi32(0);
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) {                                            \
    __m512i a   = _mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]); \
    __m512i d   = _mm512_add_epi32(_mm512_and_epi32(_mm512_srli_epi32(a, pos), one_mask), _mm512_srli_epi32(a, pos+16)); \
    counters[pos] = _mm512_add_epi32(counters[pos], d);          \
}
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (int i = 0; i < n_cycles; ++i) {
        BLOCK
    }

#undef BLOCK
#undef UPDATE

    // residual
    for (int i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) {
        uint32_t* v = (uint32_t*)(&counters[i]);
        for (int j = 0; j < 16; ++j)
            out_counters[i] += v[j];
    }
 
    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

    return 0;
}